

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

void __thiscall FastPForLib::BitWidthHistoGram::display(BitWidthHistoGram *this,string *prefix)

{
  pointer pdVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  double dVar5;
  
  pdVar1 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pdVar1;
  dVar5 = 0.0;
  if (lVar2 != 0) {
    lVar2 = lVar2 >> 3;
    lVar3 = 0;
    do {
      dVar5 = dVar5 + pdVar1[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar2 + (ulong)(lVar2 == 0) != lVar3);
  }
  if (((dVar5 != 0.0) || (NAN(dVar5))) &&
     (pdVar1 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start,
     (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
     super__Vector_impl_data._M_finish != pdVar1)) {
    uVar4 = 0;
    do {
      printf("%s%zu %f\n",pdVar1[uVar4] / dVar5,(prefix->_M_dataplus)._M_p,uVar4);
      uVar4 = uVar4 + 1;
      pdVar1 = (this->histo).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->histo).super__Vector_base<double,_std::allocator<double>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  return;
}

Assistant:

void display(std::string prefix = "") {
    double sum = 0;
    for (size_t k = 0; k < histo.size(); ++k)
      sum += histo[k];
    if (sum == 0)
      return;
    for (size_t k = 0; k < histo.size(); ++k) {
      printf("%s%zu %f\n", prefix.c_str(), k, histo[k] / sum);
    }
  }